

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

LY_ERR lysp_check_dup_typedefs(lysp_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  ly_ht *tpdfs_global;
  lysp_include *plVar2;
  ulong uVar3;
  lysp_tpdf *plVar4;
  lysp_tpdf *plVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar6 = 0;
  tpdfs_global = lyht_new(8,8,lysp_id_cmp,(void *)0x0,1);
  uVar8 = 0xffffffffffffffff;
  while( true ) {
    plVar5 = mod->typedefs;
    if (plVar5 == (lysp_tpdf *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)&plVar5[-1].flags;
    }
    uVar8 = uVar8 + 1;
    if (uVar7 <= uVar8) break;
    plVar5 = (lysp_tpdf *)((long)&plVar5->name + lVar6);
    lVar6 = lVar6 + 0xb0;
    LVar1 = lysp_check_dup_typedef(ctx,(lysp_node *)0x0,plVar5,tpdfs_global);
    if (LVar1 != LY_SUCCESS) goto LAB_0015bf14;
  }
  plVar2 = mod->includes;
  uVar8 = 0;
  while( true ) {
    uVar7 = 0xffffffffffffffff;
    if (plVar2 == (lysp_include *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)(plVar2[-1].rev + 8);
    }
    if (uVar3 <= uVar8) break;
    lVar6 = 0;
    while( true ) {
      plVar2 = mod->includes;
      plVar5 = (plVar2[uVar8].submodule)->typedefs;
      if (plVar5 == (lysp_tpdf *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)&plVar5[-1].flags;
      }
      uVar7 = uVar7 + 1;
      if (uVar3 <= uVar7) break;
      plVar5 = (lysp_tpdf *)((long)&plVar5->name + lVar6);
      lVar6 = lVar6 + 0xb0;
      LVar1 = lysp_check_dup_typedef(ctx,(lysp_node *)0x0,plVar5,tpdfs_global);
      if (LVar1 != LY_SUCCESS) goto LAB_0015bf14;
    }
    uVar8 = uVar8 + 1;
  }
  for (uVar8 = 0; uVar7 = 0xffffffffffffffff, uVar8 < (ctx->tpdfs_nodes).count; uVar8 = uVar8 + 1) {
    plVar4 = lysp_node_typedefs((lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[uVar8]);
    plVar5 = plVar4;
    while( true ) {
      if (plVar4 == (lysp_tpdf *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)&plVar4[-1].flags;
      }
      uVar7 = uVar7 + 1;
      if (uVar3 <= uVar7) break;
      LVar1 = lysp_check_dup_typedef
                        (ctx,(lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[uVar8],plVar5,
                         tpdfs_global);
      plVar5 = plVar5 + 1;
      if (LVar1 != LY_SUCCESS) goto LAB_0015bf14;
    }
  }
  LVar1 = LY_SUCCESS;
LAB_0015bf14:
  lyht_free(tpdfs_global,(_func_void_void_ptr *)0x0);
  return LVar1;
}

Assistant:

LY_ERR
lysp_check_dup_typedefs(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    struct ly_ht *ids_global;
    const struct lysp_tpdf *typedefs;
    LY_ARRAY_COUNT_TYPE u, v;
    uint32_t i;
    LY_ERR ret = LY_SUCCESS;

    /* check name collisions - typedefs and groupings */
    ids_global = lyht_new(LYHT_MIN_SIZE, sizeof(char *), lysp_id_cmp, NULL, 1);
    LY_ARRAY_FOR(mod->typedefs, v) {
        ret = lysp_check_dup_typedef(ctx, NULL, &mod->typedefs[v], ids_global);
        LY_CHECK_GOTO(ret, cleanup);
    }
    LY_ARRAY_FOR(mod->includes, v) {
        LY_ARRAY_FOR(mod->includes[v].submodule->typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, NULL, &mod->includes[v].submodule->typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }
    for (i = 0; i < ctx->tpdfs_nodes.count; ++i) {
        typedefs = lysp_node_typedefs((struct lysp_node *)ctx->tpdfs_nodes.objs[i]);
        LY_ARRAY_FOR(typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, (struct lysp_node *)ctx->tpdfs_nodes.objs[i], &typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ids_global, NULL);
    return ret;
}